

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::FilteredNormalizer2::isNormalizedUTF8
          (FilteredNormalizer2 *this,StringPiece sp,UErrorCode *errorCode)

{
  bool bVar1;
  USetSpanCondition UVar2;
  uint uVar3;
  int iVar4;
  int length;
  USetSpanCondition spanCondition;
  char *s;
  
  s = sp.ptr_;
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  length = sp.length_;
  spanCondition = USET_SPAN_SIMPLE;
  do {
    if (length < 1) {
      return '\x01';
    }
    uVar3 = UnicodeSet::spanUTF8(this->set,s,length,spanCondition);
    UVar2 = USET_SPAN_SIMPLE;
    if (spanCondition == USET_SPAN_NOT_CONTAINED) {
LAB_00315fe2:
      spanCondition = UVar2;
      s = s + (int)uVar3;
      length = length - uVar3;
      bVar1 = true;
    }
    else {
      iVar4 = (*(this->norm2->super_UObject)._vptr_UObject[0xc])(this->norm2,s,(ulong)uVar3);
      bVar1 = false;
      if (((char)iVar4 != '\0') &&
         (UVar2 = USET_SPAN_NOT_CONTAINED, *errorCode < U_ILLEGAL_ARGUMENT_ERROR))
      goto LAB_00315fe2;
    }
    if (!bVar1) {
      return '\0';
    }
  } while( true );
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }